

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  void *__ptr;
  char *pcVar6;
  undefined8 uStackY_90;
  ggwave_SampleFormat gVar7;
  char decoded [16];
  ggwave_Parameters parameters;
  
  ggwave_setLogFile(_stdout);
  ggwave_getDefaultParameters(&parameters);
  parameters.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16;
  parameters.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16;
  uVar1 = parameters._24_8_;
  parameters.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16;
  gVar7 = parameters.sampleFormatInp;
  parameters._24_8_ = uVar1;
  uVar2 = ggwave_init();
  iVar3 = ggwave_encode(uVar2,"test",4,2,0x32,0,1,parameters.sampleRateOut,
                        parameters.samplesPerFrame,gVar7,parameters.operatingMode);
  __ptr = malloc((long)iVar3);
  if (__ptr == (void *)0x0) {
    pcVar6 = "waveform != NULL";
    uStackY_90 = 0x20;
  }
  else {
    iVar3 = ggwave_encode(uVar2,"test",4,2,0x32,__ptr,0,parameters.sampleRateOut,
                          parameters.samplesPerFrame,gVar7,parameters.operatingMode);
    if (iVar3 < 1) {
      pcVar6 = "ne > 0";
      uStackY_90 = 0x23;
    }
    else {
      iVar4 = ggwave_ndecode(uVar2,__ptr,iVar3,decoded,3);
      if (iVar4 == -2) {
        iVar4 = ggwave_ndecode(uVar2,__ptr,iVar3,decoded,4);
        if (iVar4 == 4) {
          iVar4 = ggwave_decode(uVar2,__ptr,iVar3,decoded);
          if (iVar4 == 4) {
            ggwave_rxToggleProtocol(2,0);
            uVar5 = ggwave_init();
            iVar4 = ggwave_ndecode(uVar5,__ptr,iVar3,decoded,4);
            if (iVar4 == -1) {
              ggwave_free(uVar5);
              ggwave_rxToggleProtocol(2,1);
              uVar5 = ggwave_init();
              iVar3 = ggwave_ndecode(uVar5,__ptr,iVar3,decoded,4);
              if (iVar3 == 4) {
                ggwave_free(uVar5);
                decoded[4] = '\0';
                iVar3 = bcmp(decoded,"test",5);
                if (iVar3 == 0) {
                  ggwave_free(uVar2);
                  free(__ptr);
                  return 0;
                }
                pcVar6 = "strcmp(decoded, payload) == 0";
                uStackY_90 = 0x48;
              }
              else {
                pcVar6 = "ret == 4";
                uStackY_90 = 0x42;
              }
            }
            else {
              pcVar6 = "ret == -1";
              uStackY_90 = 0x37;
            }
          }
          else {
            pcVar6 = "ret == 4";
            uStackY_90 = 0x2f;
          }
        }
        else {
          pcVar6 = "ret == 4";
          uStackY_90 = 0x2b;
        }
      }
      else {
        pcVar6 = "ret == -2";
        uStackY_90 = 0x27;
      }
    }
  }
  fprintf(_stderr,"[%s:%d] Check failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
          ,uStackY_90,pcVar6);
  exit(1);
}

Assistant:

int main() {
    //ggwave_setLogFile(NULL); // disable logging
    ggwave_setLogFile(stdout);

    ggwave_Parameters parameters = ggwave_getDefaultParameters();
    parameters.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16;
    parameters.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16;

    ggwave_Instance instance = ggwave_init(parameters);

    int ret;
    const char * payload = "test";
    char decoded[16];

    int n = ggwave_encode(instance, payload, 4, GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 50, NULL, 1);
    char *waveform = malloc(n);
    CHECK(waveform != NULL);

    int ne = ggwave_encode(instance, payload, 4, GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 50, waveform, 0);
    CHECK(ne > 0);

    // not enough output buffer size to store the decoded message
    ret = ggwave_ndecode(instance, waveform, ne, decoded, 3);
    CHECK(ret == -2); // fail

    // just enough size to store it
    ret = ggwave_ndecode(instance, waveform, ne, decoded, 4);
    CHECK(ret == 4); // success

    // unsafe method - will write the decoded output to the output buffer regardless of the size
    ret = ggwave_decode(instance, waveform, ne, decoded);
    CHECK(ret == 4);

    // disable Rx protocol
    {
        ggwave_rxToggleProtocol(GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 0);
        ggwave_Instance instanceTmp = ggwave_init(parameters);

        ret = ggwave_ndecode(instanceTmp, waveform, ne, decoded, 4);
        CHECK(ret == -1); // fail

        ggwave_free(instanceTmp);
    }

    // enable Rx protocol
    {
        ggwave_rxToggleProtocol(GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 1);
        ggwave_Instance instanceTmp = ggwave_init(parameters);

        ret = ggwave_ndecode(instanceTmp, waveform, ne, decoded, 4);
        CHECK(ret == 4); // success

        ggwave_free(instanceTmp);
    }

    decoded[ret] = 0; // null-terminate the received data
    CHECK(strcmp(decoded, payload) == 0);

    ggwave_free(instance);
    free(waveform);

    return 0;
}